

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::decodeString(OurReader *this,Token *token,String *decoded)

{
  char cVar1;
  bool bVar2;
  uint cp;
  Location end;
  Location extra;
  uint unicode;
  OurReader *local_60;
  Location local_58;
  String local_50;
  
  local_60 = this;
  std::__cxx11::string::reserve((ulong)decoded);
  end = token->end_ + -1;
  local_58 = token->start_ + 1;
LAB_001238c9:
  do {
    if (local_58 == end) {
      return true;
    }
    extra = local_58 + 1;
    if (*local_58 != '\\') {
      if (*local_58 == '\"') {
        return true;
      }
      goto LAB_001239d2;
    }
    if (extra == end) {
      local_58 = extra;
      std::__cxx11::string::string
                ((string *)&local_50,"Empty escape sequence in string",(allocator *)&unicode);
      addError(local_60,&local_50,token,extra);
      goto LAB_00123a0a;
    }
    extra = local_58 + 2;
    cVar1 = local_58[1];
    local_58 = extra;
    switch(cVar1) {
    case 'n':
      break;
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_00123955_caseD_6f:
      std::__cxx11::string::string
                ((string *)&local_50,"Bad escape sequence in string",(allocator *)&unicode);
      addError(local_60,&local_50,token,extra);
LAB_00123a0a:
      std::__cxx11::string::~string((string *)&local_50);
      return false;
    case 'r':
      break;
    case 't':
      break;
    case 'u':
      goto switchD_00123955_caseD_75;
    default:
      if ((((cVar1 != 'f') && (cVar1 != '/')) && (cVar1 != '\\')) &&
         ((cVar1 != 'b' && (cVar1 != '\"')))) goto switchD_00123955_caseD_6f;
    }
LAB_001239d2:
    local_58 = extra;
    std::__cxx11::string::push_back((char)decoded);
    local_58 = extra;
  } while( true );
switchD_00123955_caseD_75:
  bVar2 = decodeUnicodeCodePoint(local_60,token,&local_58,end,&unicode);
  if (!bVar2) {
    return false;
  }
  codePointToUTF8_abi_cxx11_(&local_50,(Json *)(ulong)unicode,cp);
  std::__cxx11::string::append((string *)decoded);
  std::__cxx11::string::~string((string *)&local_50);
  goto LAB_001238c9;
}

Assistant:

bool OurReader::decodeString(Token& token, String& decoded) {
  decoded.reserve(static_cast<size_t>(token.end_ - token.start_ - 2));
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}